

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

int __thiscall FNodeBuilder::FVertexMap::SelectVertexClose(FVertexMap *this,FPrivVert *vert)

{
  int iVar1;
  TArray<int,_int> *pTVar2;
  FPrivVert *pFVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  pTVar2 = this->VertexGrid;
  iVar4 = GetBlock(this,(vert->super_FSimpleVert).x,(vert->super_FSimpleVert).y);
  pFVar3 = (this->MyBuilder->Vertices).Array;
  uVar6 = 0;
  do {
    if (pTVar2[iVar4].Count == uVar6) {
      iVar4 = InsertVertex(this,vert);
      return iVar4;
    }
    iVar1 = pTVar2[iVar4].Array[uVar6];
    uVar7 = pFVar3[iVar1].super_FSimpleVert.x - (vert->super_FSimpleVert).x;
    uVar5 = -uVar7;
    if (0 < (int)uVar7) {
      uVar5 = uVar7;
    }
    if (uVar5 < 6) {
      uVar7 = pFVar3[iVar1].super_FSimpleVert.y - (vert->super_FSimpleVert).y;
      uVar5 = -uVar7;
      if (0 < (int)uVar7) {
        uVar5 = uVar7;
      }
      if (uVar5 < 6) {
        return iVar1;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int FNodeBuilder::FVertexMap::SelectVertexClose (FNodeBuilder::FPrivVert &vert)
{
	TArray<int> &block = VertexGrid[GetBlock (vert.x, vert.y)];
	FPrivVert *vertices = &MyBuilder.Vertices[0];
	unsigned int i;

	for (i = 0; i < block.Size(); ++i)
	{
#if VERTEX_EPSILON <= 1
		if (vertices[block[i]].x == vert.x && vertices[block[i]].y == vert.y)
#else
		if (abs(vertices[block[i]].x - vert.x) < VERTEX_EPSILON &&
			abs(vertices[block[i]].y - vert.y) < VERTEX_EPSILON)
#endif
		{
			return block[i];
		}
	}

	// Not present: add it!
	return InsertVertex (vert);
}